

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  bool bVar1;
  StandardWriterPageState<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *pSVar2;
  ValidityMask *this_00;
  ClientContext *pCVar3;
  long lVar4;
  InternalException *this_01;
  ColumnWriterStatistics *in_RDX;
  BssEncoder *in_RDI;
  ulong in_R9;
  ulong in_stack_00000008;
  long target_value_4;
  idx_t r_3;
  long target_value_3;
  long target_value_2;
  idx_t r_2;
  long target_value_1;
  long target_value;
  idx_t r_1;
  uint32_t value_index;
  dtime_tz_t *src_value;
  idx_t r;
  dtime_tz_t *data_ptr;
  ValidityMask *mask;
  StandardWriterPageState<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *page_state;
  WriteStream *in_stack_00003ef8;
  ValidityMask *in_stack_00003f00;
  idx_t in_stack_00003f08;
  idx_t in_stack_00003f10;
  ColumnWriterStatistics *in_stack_00003f18;
  Vector *in_stack_00003f20;
  undefined7 in_stack_fffffffffffffec8;
  uchar in_stack_fffffffffffffecf;
  dtime_tz_t in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  allocator *paVar5;
  RleBpEncoder *in_stack_fffffffffffffee0;
  Allocator *in_stack_fffffffffffffee8;
  long *in_stack_ffffffffffffff08;
  WriteStream *in_stack_ffffffffffffff10;
  Allocator *in_stack_ffffffffffffff18;
  DlbaEncoder *in_stack_ffffffffffffff20;
  ulong local_b8;
  ulong local_90;
  ulong local_68;
  ulong local_50;
  
  pSVar2 = ColumnWriterPageState::
           Cast<duckdb::StandardWriterPageState<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator>>
                     ((ColumnWriterPageState *)in_stack_fffffffffffffed0.bits);
  this_00 = FlatVector::Validity((Vector *)0x5d640e);
  FlatVector::GetData<duckdb::dtime_tz_t>((Vector *)0x5d6423);
  switch(pSVar2->encoding) {
  case PLAIN:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                      ((TemplatedValidityMask<unsigned_long> *)this_00);
    if (bVar1) {
      TemplatedWritePlain<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator,true>
                (in_stack_00003f20,in_stack_00003f18,in_stack_00003f10,in_stack_00003f08,
                 in_stack_00003f00,in_stack_00003ef8);
    }
    else {
      TemplatedWritePlain<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator,false>
                (in_stack_00003f20,in_stack_00003f18,in_stack_00003f10,in_stack_00003f08,
                 in_stack_00003f00,in_stack_00003ef8);
    }
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar5 = (allocator *)&stack0xffffffffffffff17;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff18,"Unknown encoding",paVar5);
    duckdb::InternalException::InternalException(this_01,(string *)&stack0xffffffffffffff18);
    __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
  case DELTA_BINARY_PACKED:
    local_68 = in_R9;
    if ((pSVar2->dbp_initialized & 1U) == 0) {
      for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0.bits);
        if (bVar1) {
          lVar4 = ParquetTimeTZOperator::Operation<duckdb::dtime_tz_t,long>
                            (in_stack_fffffffffffffed0);
          BaseParquetOperator::HandleStats<duckdb::dtime_tz_t,long>(in_RDX,lVar4);
          DbpEncoder::BeginWrite<long>
                    ((DbpEncoder *)in_stack_fffffffffffffed0.bits,
                     (WriteStream *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                     (int64_t *)0x5d6663);
          pSVar2->dbp_initialized = true;
          local_68 = local_68 + 1;
          break;
        }
      }
    }
    for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
      lVar4 = ParquetTimeTZOperator::Operation<duckdb::dtime_tz_t,long>(in_stack_fffffffffffffed0);
      BaseParquetOperator::HandleStats<duckdb::dtime_tz_t,long>(in_RDX,lVar4);
      DbpEncoder::WriteValue<long>
                ((DbpEncoder *)in_stack_fffffffffffffed0.bits,
                 (WriteStream *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (int64_t *)0x5d671f);
    }
    break;
  case DELTA_LENGTH_BYTE_ARRAY:
    local_90 = in_R9;
    if ((pSVar2->dlba_initialized & 1U) == 0) {
      for (; local_90 < in_stack_00000008; local_90 = local_90 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0.bits);
        if (bVar1) {
          lVar4 = ParquetTimeTZOperator::Operation<duckdb::dtime_tz_t,long>
                            (in_stack_fffffffffffffed0);
          BaseParquetOperator::HandleStats<duckdb::dtime_tz_t,long>(in_RDX,lVar4);
          pCVar3 = ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
          duckdb::BufferAllocator::Get(pCVar3);
          DlbaEncoder::BeginWrite<long>
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
          pSVar2->dlba_initialized = true;
          local_90 = local_90 + 1;
          break;
        }
      }
    }
    for (; local_90 < in_stack_00000008; local_90 = local_90 + 1) {
      lVar4 = ParquetTimeTZOperator::Operation<duckdb::dtime_tz_t,long>(in_stack_fffffffffffffed0);
      BaseParquetOperator::HandleStats<duckdb::dtime_tz_t,long>(in_RDX,lVar4);
      DlbaEncoder::WriteValue<long>
                (in_stack_ffffffffffffff20,(WriteStream *)in_stack_ffffffffffffff18,
                 (long *)in_stack_ffffffffffffff10);
    }
    break;
  case RLE_DICTIONARY:
    local_50 = in_R9;
    if ((pSVar2->dict_written_value & 1U) == 0) {
      for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0.bits);
        if (bVar1) {
          WriteStream::Write<unsigned_char>
                    ((WriteStream *)in_stack_fffffffffffffed0.bits,in_stack_fffffffffffffecf);
          RleBpEncoder::BeginWrite(&pSVar2->dict_encoder);
          pSVar2->dict_written_value = true;
          break;
        }
      }
    }
    for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
      PrimitiveDictionary<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>::GetIndex
                ((PrimitiveDictionary<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *)
                 in_stack_fffffffffffffed0.bits,
                 (dtime_tz_t *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      RleBpEncoder::WriteValue
                (in_stack_fffffffffffffee0,(WriteStream *)in_stack_fffffffffffffed8,
                 (uint32_t *)in_stack_fffffffffffffed0.bits);
    }
    break;
  case BYTE_STREAM_SPLIT:
    local_b8 = in_R9;
    if ((pSVar2->bss_initialized & 1U) != 0) {
      in_stack_fffffffffffffee0 = (RleBpEncoder *)&pSVar2->bss_encoder;
      pCVar3 = ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
      duckdb::BufferAllocator::Get(pCVar3);
      BssEncoder::BeginWrite(in_RDI,in_stack_fffffffffffffee8);
      pSVar2->bss_initialized = true;
    }
    for (; local_b8 < in_stack_00000008; local_b8 = local_b8 + 1) {
      lVar4 = ParquetTimeTZOperator::Operation<duckdb::dtime_tz_t,long>(in_stack_fffffffffffffed0);
      BaseParquetOperator::HandleStats<duckdb::dtime_tz_t,long>(in_RDX,lVar4);
      BssEncoder::WriteValue<long>
                ((BssEncoder *)in_stack_fffffffffffffee0,(long *)in_stack_fffffffffffffed8);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}